

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bgpsec.c
# Opt level: O0

void originate_and_validate_test(void)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  int iVar3;
  rtr_bgpsec_nlri *nlri;
  rtr_bgpsec *bgpsec_00;
  rtr_secure_path_seg *new_seg;
  spki_record *spki_record;
  spki_record *spki_record_00;
  long in_FS_OFFSET;
  uint8_t flags;
  uint8_t pcount;
  uint32_t target_as;
  uint32_t my_as;
  uint16_t afi;
  uint8_t safi;
  uint8_t alg;
  rtr_bgpsec_rtvals result;
  rtr_secure_path_seg *new_sec;
  spki_record *record2;
  spki_record *record1;
  rtr_bgpsec_nlri *pfx;
  rtr_bgpsec *bgpsec;
  rtr_signature_seg *new_sig;
  undefined1 local_180 [4];
  int pfx_int;
  spki_table table;
  
  table.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  new_sig._4_4_ = 0;
  bgpsec = (rtr_bgpsec *)0x0;
  nlri = rtr_mgr_bgpsec_nlri_new(3);
  nlri->nlri_len = '\x18';
  nlri->afi = 1;
  uVar2 = htonl(0xc0000200);
  puVar1 = nlri->nlri;
  new_sig._4_2_ = (undefined2)uVar2;
  *(undefined2 *)puVar1 = new_sig._4_2_;
  new_sig._6_1_ = (uint8_t)(uVar2 >> 0x10);
  puVar1[2] = new_sig._6_1_;
  new_sig._4_4_ = uVar2;
  bgpsec_00 = rtr_mgr_bgpsec_new('\x01','\x01',1,0xfbf0,0x10000,nlri);
  new_seg = rtr_mgr_bgpsec_new_secure_path_seg('\x01','\0',0xfbf0);
  rtr_mgr_bgpsec_prepend_sec_path_seg(bgpsec_00,new_seg);
  spki_table_init((spki_table *)local_180,(spki_update_fp)0x0);
  spki_record = create_record(0x10000,ski1,spki1);
  spki_record_00 = create_record(0xfbf0,ski2,spki2);
  spki_table_add_entry((spki_table *)local_180,spki_record_00);
  spki_table_add_entry((spki_table *)local_180,spki_record);
  rtr_bgpsec_generate_signature(bgpsec_00,private_key,(rtr_signature_seg **)&bgpsec);
  if (*(short *)((long)&bgpsec->sigs + 4) == 0) {
    __assert_fail("new_sig->sig_len > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x16c,"void originate_and_validate_test(void)");
  }
  *(undefined8 *)&bgpsec->target_as = ski2._0_8_;
  bgpsec->nlri = (rtr_bgpsec_nlri *)ski2._8_8_;
  *(undefined4 *)&bgpsec->sigs = ski2._16_4_;
  iVar3 = rtr_mgr_bgpsec_prepend_sig_seg(bgpsec_00,(rtr_signature_seg *)bgpsec);
  if (iVar3 != 0) {
    __assert_fail("result == RTR_BGPSEC_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x173,"void originate_and_validate_test(void)");
  }
  iVar3 = rtr_bgpsec_validate_as_path(bgpsec_00,(spki_table *)local_180);
  if (iVar3 != 1) {
    __assert_fail("result == RTR_BGPSEC_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_bgpsec.c"
                  ,0x177,"void originate_and_validate_test(void)");
  }
  spki_table_free((spki_table *)local_180);
  free(spki_record_00);
  free(spki_record);
  rtr_mgr_bgpsec_free(bgpsec_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == table.lock._48_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void originate_and_validate_test(void)
{
	/* AS(64496)--->AS(65536)--->AS(65537) */
	struct rtr_bgpsec *bgpsec = NULL;
	struct rtr_bgpsec_nlri *pfx = NULL;
	int pfx_int = 0;

	struct spki_table table;
	struct spki_record *record1;
	struct spki_record *record2;

	struct rtr_signature_seg *new_sig = NULL;
	struct rtr_secure_path_seg *new_sec = NULL;

	enum rtr_bgpsec_rtvals result;

	uint8_t alg = 1;
	uint8_t safi = 1;
	uint16_t afi = 1;
	uint32_t my_as = 64496;
	uint32_t target_as = 65536;

	pfx = rtr_mgr_bgpsec_nlri_new(3);
	pfx->nlri_len = 24;
	pfx->afi = 1; /* LRTR_IPV4 */
	pfx_int = htonl(3221225984); /* 192.0.2.0 */

	memcpy(pfx->nlri, &pfx_int, 3);

	bgpsec = rtr_mgr_bgpsec_new(alg, safi, afi, my_as, target_as, pfx);

	/* init the rtr_signature_seg and rtr_secure_path_seg structs. */

	uint8_t pcount = 1;
	uint8_t flags = 0;

	new_sec = rtr_mgr_bgpsec_new_secure_path_seg(pcount, flags, my_as);
	rtr_mgr_bgpsec_prepend_sec_path_seg(bgpsec, new_sec);

	/* init the SPKI table and store two router keys in it. */
	spki_table_init(&table, NULL);
	record2 = create_record(65536, ski1, spki1);
	record1 = create_record(64496, ski2, spki2);

	spki_table_add_entry(&table, record1);
	spki_table_add_entry(&table, record2);

	/* Generate a signature... */
	result = rtr_bgpsec_generate_signature(bgpsec, private_key, &new_sig);
	assert(new_sig->sig_len > 0);

	/* ... copy the SKI to the new_sig struct... */
	memcpy(new_sig->ski, ski2, SKI_SIZE);

	/* ... prepend the new signature to bgpsec... */
	result = rtr_mgr_bgpsec_prepend_sig_seg(bgpsec, new_sig);
	assert(result == RTR_BGPSEC_SUCCESS);

	/* ... and validate the freshly generated signature. */
	result = rtr_bgpsec_validate_as_path(bgpsec, &table);
	assert(result == RTR_BGPSEC_VALID);

	/* Free all allocated memory. */
	spki_table_free(&table);
	free(record1);
	free(record2);
	rtr_mgr_bgpsec_free(bgpsec);
}